

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

void __thiscall
MADPComponentFactoredStates::~MADPComponentFactoredStates(MADPComponentFactoredStates *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppSVar3;
  reference ppVar4;
  undefined8 *in_RDI;
  Index i;
  map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
  *in_stack_ffffffffffffff88;
  map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
  *in_stack_ffffffffffffff90;
  void *pvVar5;
  iterator __position;
  iterator in_stack_ffffffffffffffa0;
  uint local_c;
  
  *in_RDI = &PTR__MADPComponentFactoredStates_00d4cf68;
  for (local_c = 0;
      sVar2 = std::vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>::size
                        ((vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_> *)
                         (in_RDI + 8)), local_c != sVar2; local_c = local_c + 1) {
    ppSVar3 = std::vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>::at
                        ((vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_> *)
                         in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
    if (*ppSVar3 != (value_type)0x0) {
      (*((*ppSVar3)->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[1])();
    }
  }
  if ((long *)in_RDI[0xe] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0xe] + 8))();
  }
  while (bVar1 = std::
                 map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
                 ::empty((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
                          *)0xafcfa4), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
    ::begin(in_stack_ffffffffffffff88);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>
                          *)0xafcfc9);
    if (ppVar4->second != (State *)0x0) {
      (*(ppVar4->second->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[1])();
    }
    __position._M_node = (_Base_ptr)in_RDI[0xf];
    std::
    map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
    ::begin(in_stack_ffffffffffffff88);
    in_stack_ffffffffffffffa0 =
         std::
         map<std::vector<unsigned_int,std::allocator<unsigned_int>>,State*,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
         ::erase_abi_cxx11_(in_stack_ffffffffffffff90,__position);
  }
  pvVar5 = (void *)in_RDI[0xf];
  if (pvVar5 != (void *)0x0) {
    std::
    map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
    ::~map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
            *)0xafd03e);
    operator_delete(pvVar5,0x30);
  }
  if ((void *)in_RDI[7] != (void *)0x0) {
    operator_delete__((void *)in_RDI[7]);
  }
  Scope::~Scope((Scope *)0xafd077);
  std::vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>::~vector
            ((vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_> *)
             in_stack_ffffffffffffffa0._M_node);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffffa0._M_node);
  return;
}

Assistant:

MADPComponentFactoredStates::~MADPComponentFactoredStates()
{
    for(Index i=0;i!=_m_stateFactors.size();++i)
        delete _m_stateFactors.at(i);
    delete _m_initialStateDistribution;

    while( !_m_jointStatesMap->empty() )
    {
        delete (*_m_jointStatesMap->begin()).second;
        _m_jointStatesMap->erase( _m_jointStatesMap->begin() );
    }
    delete _m_jointStatesMap;
    delete [] _m_stepSize;
}